

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O0

parser_error parse_constants_ranged_critical_level(parser *p)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  char *name;
  undefined8 *puVar4;
  long *local_48;
  critical_level *cursor;
  wchar_t msgt;
  char *msgt_str;
  uint chance;
  critical_level *new_level;
  angband_constants *z;
  parser *p_local;
  
  pvVar3 = parser_priv(p);
  uVar1 = parser_getuint(p,"chance");
  name = parser_getstr(p,"msg");
  iVar2 = message_lookup_by_name(name);
  if (uVar1 == 0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_VALUE;
  }
  else if (iVar2 < 0) {
    p_local._4_4_ = PARSE_ERROR_INVALID_MESSAGE;
  }
  else {
    puVar4 = (undefined8 *)mem_alloc(0x18);
    *puVar4 = 0;
    *(uint *)(puVar4 + 1) = uVar1;
    uVar1 = parser_getuint(p,"dice");
    *(uint *)((long)puVar4 + 0xc) = uVar1;
    *(int *)(puVar4 + 2) = iVar2;
    if (*(long *)((long)pvVar3 + 0xf0) == 0) {
      *(undefined8 **)((long)pvVar3 + 0xf0) = puVar4;
    }
    else {
      for (local_48 = *(long **)((long)pvVar3 + 0xf0); *local_48 != 0; local_48 = (long *)*local_48)
      {
      }
      *local_48 = (long)puVar4;
    }
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_constants_ranged_critical_level(struct parser *p)
{
	struct angband_constants *z = parser_priv(p);
	struct critical_level *new_level;
	unsigned int chance = parser_getuint(p, "chance");
	const char *msgt_str = parser_getstr(p, "msg");
	int msgt = message_lookup_by_name(msgt_str);

	if (chance == 0) {
		return PARSE_ERROR_INVALID_VALUE;
	}
	if (msgt < 0) {
		return PARSE_ERROR_INVALID_MESSAGE;
	}
	new_level = mem_alloc(sizeof(*new_level));
	new_level->next = NULL;
	new_level->chance = chance;
	new_level->added_dice = parser_getuint(p, "dice");
	new_level->msgt = msgt;
	/* Add it to the end of the linked list. */
	if (z->r_crit_level_head) {
		struct critical_level *cursor = z->r_crit_level_head;

		while (cursor->next) {
			cursor = cursor->next;
		}
		cursor->next = new_level;
	} else {
		z->r_crit_level_head = new_level;
	}

	return PARSE_ERROR_NONE;
}